

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O1

bool __thiscall
duckdb::StrpTimeFormat::ParseResult::TryToTimestampNS(ParseResult *this,timestamp_ns_t *result)

{
  long lVar1;
  bool bVar2;
  undefined8 in_RAX;
  int64_t right;
  date_t date;
  date_t local_14;
  
  local_14.days = (int32_t)((ulong)in_RAX >> 0x20);
  bVar2 = Date::TryFromDate(this->data[0],this->data[1],this->data[2],&local_14);
  if (bVar2) {
    right = ToTimeNS(this);
    bVar2 = TryMultiplyOperator::Operation<long,long,long>
                      ((long)local_14.days,86400000000000,(int64_t *)result);
    if ((bVar2) &&
       (bVar2 = TryAddOperator::Operation<long,long,long>
                          ((result->super_timestamp_t).value,right,(int64_t *)result), bVar2)) {
      lVar1 = (result->super_timestamp_t).value;
      return lVar1 != -0x7fffffffffffffff && lVar1 != 0x7fffffffffffffff;
    }
  }
  return false;
}

Assistant:

bool StrpTimeFormat::ParseResult::TryToTimestampNS(timestamp_ns_t &result) {
	date_t date;
	if (!TryToDate(date)) {
		return false;
	}

	// Don't use rounded µs
	const auto time = ToTimeNS();
	if (!TryMultiplyOperator::Operation<int64_t, int64_t, int64_t>(date.days, Interval::NANOS_PER_DAY, result.value)) {
		return false;
	}
	if (!TryAddOperator::Operation<int64_t, int64_t, int64_t>(result.value, time, result.value)) {
		return false;
	}
	return Timestamp::IsFinite(result);
}